

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_fmul_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  float32 fVar10;
  float64 fVar11;
  long lVar12;
  uint uVar13;
  float64 *pfVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_48;
  float64 afStack_40 [2];
  
  lVar5 = (ulong)ws * 0x10 + 0x228;
  lVar6 = (ulong)wt * 0x10 + 0x228;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar12 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar10 = float32_mul_mips(*(float32 *)
                                 ((long)(env->active_fpu).fpr + lVar12 * 4 + lVar5 + -0x228),
                                *(float32 *)
                                 ((long)(env->active_fpu).fpr + lVar12 * 4 + lVar6 + -0x228),pfVar2)
      ;
      *(float32 *)((long)afStack_40 + lVar12 * 4 + -8) = fVar10;
      if ((fVar10 & 0x7fffffff) == 0) {
        uVar17 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar17 = (uint)bVar4;
        if ((fVar10 & 0x7f800000) == 0) {
          uVar17 = bVar4 | 0x10;
        }
      }
      uVar8 = ieee_ex_to_mips_mips(uVar17);
      uVar13 = (env->active_tc).msacsr;
      uVar16 = (uVar13 & 0x1000000) >> 0x18 & uVar17 >> 6;
      uVar15 = 3;
      if ((uVar13 & 0x1000000) == 0) {
        uVar15 = uVar16;
      }
      if (uVar17 < 0x80) {
        uVar15 = uVar16;
      }
      uVar15 = uVar15 | uVar8;
      uVar16 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar8 >> 2);
      uVar9 = uVar16 | uVar15;
      uVar17 = uVar8 & 0xfffffffc;
      if ((uVar16 != 0 || (uVar15 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar17 = uVar9;
      }
      if ((uVar15 & 2) == 0) {
        uVar17 = uVar9;
      }
      if ((uVar17 & (uVar13 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar17 << 0xc;
LAB_0076bf8c:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar13;
        if (((uVar13 >> 7 & 0x1f | 0x20) & uVar17) != 0) goto LAB_0076bfa7;
      }
      else {
        if ((uVar13 >> 0x12 & 1) == 0) {
          uVar15 = uVar17 << 0xc | uVar13;
          uVar13 = uVar13 & 0xfff80fff;
          goto LAB_0076bf8c;
        }
LAB_0076bfa7:
        fVar10 = float32_default_nan_mips(pfVar2);
        *(float32 *)((long)afStack_40 + lVar12 * 4 + -8) = fVar10 & 0xffffffc0 ^ 0x400000 | uVar17;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x18f0,
                    "void helper_msa_fmul_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    pfVar14 = &local_48;
    lVar12 = 0;
    bVar7 = true;
    do {
      bVar18 = bVar7;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar11 = float64_mul_mips(*(float64 *)
                                 ((long)(env->active_fpu).fpr + lVar12 * 8 + lVar5 + -0x228),
                                *(float64 *)
                                 ((long)(env->active_fpu).fpr + lVar12 * 8 + lVar6 + -0x228),pfVar2)
      ;
      *pfVar14 = fVar11;
      if ((fVar11 & 0x7fffffffffffffff) == 0) {
        uVar17 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar17 = (uint)bVar4;
        if ((fVar11 & 0x7ff0000000000000) == 0) {
          uVar17 = bVar4 | 0x10;
        }
      }
      uVar8 = ieee_ex_to_mips_mips(uVar17);
      uVar13 = (env->active_tc).msacsr;
      uVar16 = (uVar13 & 0x1000000) >> 0x18 & uVar17 >> 6;
      uVar15 = 3;
      if ((uVar13 & 0x1000000) == 0) {
        uVar15 = uVar16;
      }
      if (uVar17 < 0x80) {
        uVar15 = uVar16;
      }
      uVar15 = uVar15 | uVar8;
      uVar16 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar8 >> 2);
      uVar9 = uVar16 | uVar15;
      uVar17 = uVar8 & 0xfffffffc;
      if ((uVar16 != 0 || (uVar15 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar17 = uVar9;
      }
      if ((uVar15 & 2) == 0) {
        uVar17 = uVar9;
      }
      if ((uVar17 & (uVar13 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar17 << 0xc;
LAB_0076be40:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar13;
        if (((uVar13 >> 7 & 0x1f | 0x20) & uVar17) != 0) goto LAB_0076be5b;
      }
      else {
        if ((uVar13 >> 0x12 & 1) == 0) {
          uVar15 = uVar17 << 0xc | uVar13;
          uVar13 = uVar13 & 0xfff80fff;
          goto LAB_0076be40;
        }
LAB_0076be5b:
        fVar11 = float64_default_nan_mips(pfVar2);
        *pfVar14 = (long)(int)uVar17 | fVar11 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar12 = 1;
      pfVar14 = afStack_40;
      bVar7 = false;
    } while (bVar18);
  }
  uVar17 = (env->active_tc).msacsr;
  uVar13 = uVar17 >> 7 & 0x1f | 0x20;
  if ((uVar13 & uVar17 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar13);
  }
  (env->active_tc).msacsr = (uVar17 >> 0xc & 0x1f) << 2 | uVar17;
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = local_48;
  (&pfVar3->fd)[1] = afStack_40[0];
  return;
}

Assistant:

void helper_msa_fmul_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_BINOP(pwx->w[i], mul, pws->w[i], pwt->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_BINOP(pwx->d[i], mul, pws->d[i], pwt->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}